

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

const_buffer *
booster::aio::details::advance<booster::aio::const_buffer>
          (const_buffer *__return_storage_ptr__,const_buffer *buf,size_t n)

{
  ulong uVar1;
  unsigned_long uVar2;
  entry *peVar3;
  bool bVar4;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar5;
  
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar5 = buffer_impl<const_char_*>::get(&buf->super_buffer_impl<const_char_*>);
  uVar2 = pVar5.second;
  while( true ) {
    peVar3 = pVar5.first;
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if ((bVar4) || (n == 0)) break;
    uVar1 = peVar3->size;
    if (uVar1 < n || uVar1 - n == 0) {
      n = n - uVar1;
    }
    else {
      buffer_impl<const_char_*>::add
                (&__return_storage_ptr__->super_buffer_impl<const_char_*>,peVar3->ptr + n,uVar1 - n)
      ;
      n = 0;
    }
    pVar5.second = uVar2;
    pVar5.first = peVar3 + 1;
  }
  for (uVar2 = 0; pVar5.second != uVar2; uVar2 = uVar2 + 1) {
    buffer_impl<const_char_*>::add
              (&__return_storage_ptr__->super_buffer_impl<const_char_*>,peVar3->ptr,peVar3->size);
    peVar3 = peVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Buffer advance(Buffer const &buf,size_t n)
			{
				Buffer res;
				typename Buffer::buffer_data_type data=buf.get();
				while(data.second > 0 && n > 0) {
					if(data.first->size <= n) {
						n-= data.first->size;
						data.second--;
						data.first++;
					}
					else {
						res.add(data.first->ptr + n,data.first->size - n);
						n=0;
						data.second--;
						data.first++;
					}
				}
				while(data.second > 0) {
					res.add(data.first->ptr,data.first->size);
					data.second--;
					data.first++;
				}
				return res;
			}